

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroll.cpp
# Opt level: O2

ir_visitor_status __thiscall
loop_unroll_count::visit_enter(loop_unroll_count *this,ir_dereference_array *ir)

{
  GLboolean GVar1;
  glsl_type *pgVar2;
  ir_rvalue *piVar3;
  loop_variable_state *this_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  undefined4 extraout_var;
  long lVar8;
  undefined4 extraout_var_01;
  loop_variable *plVar9;
  undefined4 extraout_var_00;
  
  if (((this->options->EmitNoIndirectSampler != '\0') &&
      (pgVar2 = ir->array->type, pgVar2->field_0x4 == '\x11')) &&
     (bVar4 = glsl_type::contains_sampler(pgVar2), bVar4)) {
    piVar3 = ir->array_index;
    pvVar7 = ralloc_parent(ir);
    iVar5 = (*(piVar3->super_ir_instruction)._vptr_ir_instruction[6])(piVar3,pvVar7,0);
    if (CONCAT44(extraout_var,iVar5) != 0) goto LAB_0016bae2;
    goto LAB_0016bb93;
  }
LAB_0016bae2:
  pgVar2 = ir->array->type;
  uVar6 = (uint)(byte)pgVar2->field_0x4;
  if ((uVar6 != 0x11) && (2 < uVar6 - 2 || pgVar2->matrix_columns < 2)) {
    return visit_continue;
  }
  if ((ir->array_index != (ir_rvalue *)0x0) &&
     ((ir->array_index->super_ir_instruction).ir_type == ir_type_constant)) {
    return visit_continue;
  }
  iVar5 = (*(ir->array->super_ir_instruction)._vptr_ir_instruction[8])();
  lVar8 = CONCAT44(extraout_var_00,iVar5);
  this_00 = this->ls;
  iVar5 = (*(ir->array_index->super_ir_instruction)._vptr_ir_instruction[8])();
  plVar9 = loop_variable_state::get(this_00,(ir_variable *)CONCAT44(extraout_var_01,iVar5));
  if (lVar8 == 0) {
    return visit_continue;
  }
  if (plVar9 == (loop_variable *)0x0) {
    return visit_continue;
  }
  if (plVar9->increment == (ir_rvalue *)0x0) {
    return visit_continue;
  }
  if (*(int *)(*(long *)(lVar8 + 0x20) + 0xc) == this->ls->limiting_terminator->iterations) {
    this->array_indexed_by_induction_var_with_exact_iterations = true;
  }
  switch(*(uint *)(lVar8 + 0x40) >> 0xc & 0xf) {
  case 0:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0xb:
    GVar1 = this->options->EmitNoIndirectTemp;
    break;
  case 1:
  case 2:
    GVar1 = this->options->EmitNoIndirectUniform;
    goto joined_r0x0016bbc5;
  default:
    goto switchD_0016bb87_caseD_3;
  case 4:
    GVar1 = this->options->EmitNoIndirectInput;
joined_r0x0016bbc5:
    if (GVar1 == '\0') {
      return visit_continue;
    }
    goto LAB_0016bb93;
  case 5:
    GVar1 = this->options->EmitNoIndirectOutput;
  }
  if (GVar1 != '\0') {
LAB_0016bb93:
    this->unsupported_variable_indexing = true;
  }
switchD_0016bb87_caseD_3:
  return visit_continue;
}

Assistant:

virtual ir_visitor_status visit_enter(ir_dereference_array *ir)
   {
      /* Force unroll in case of dynamic indexing with sampler arrays
       * when EmitNoIndirectSampler is set.
       */
      if (options->EmitNoIndirectSampler) {
         if ((ir->array->type->is_array() &&
              ir->array->type->contains_sampler()) &&
             !ir->array_index->constant_expression_value(ralloc_parent(ir))) {
            unsupported_variable_indexing = true;
            return visit_continue;
         }
      }

      /* Check for arrays variably-indexed by a loop induction variable.
       * Unrolling the loop may convert that access into constant-indexing.
       *
       * Many drivers don't support particular kinds of variable indexing,
       * and have to resort to using lower_variable_index_to_cond_assign to
       * handle it.  This results in huge amounts of horrible code, so we'd
       * like to avoid that if possible.  Here, we just note that it will
       * happen.
       */
      if ((ir->array->type->is_array() || ir->array->type->is_matrix()) &&
          !ir->array_index->as_constant()) {
         ir_variable *array = ir->array->variable_referenced();
         loop_variable *lv = ls->get(ir->array_index->variable_referenced());
         if (array && lv && lv->is_induction_var()) {
            /* If an array is indexed by a loop induction variable, and the
             * array size is exactly the number of loop iterations, this is
             * probably a simple for-loop trying to access each element in
             * turn; the application may expect it to be unrolled.
             */
            if (int(array->type->length) == ls->limiting_terminator->iterations)
               array_indexed_by_induction_var_with_exact_iterations = true;

            switch (array->data.mode) {
            case ir_var_auto:
            case ir_var_temporary:
            case ir_var_const_in:
            case ir_var_function_in:
            case ir_var_function_out:
            case ir_var_function_inout:
               if (options->EmitNoIndirectTemp)
                  unsupported_variable_indexing = true;
               break;
            case ir_var_uniform:
            case ir_var_shader_storage:
               if (options->EmitNoIndirectUniform)
                  unsupported_variable_indexing = true;
               break;
            case ir_var_shader_in:
               if (options->EmitNoIndirectInput)
                  unsupported_variable_indexing = true;
               break;
            case ir_var_shader_out:
               if (options->EmitNoIndirectOutput)
                  unsupported_variable_indexing = true;
               break;
            }
         }
      }
      return visit_continue;
   }